

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O2

void __thiscall Assimp::MDL::HalfLife::HL1MDLLoader::read_attachments(HL1MDLLoader *this)

{
  int iVar1;
  uint uVar2;
  Header_HL1 *pHVar3;
  aiNode *paVar4;
  aiNode **ppaVar5;
  aiMetadata *paVar6;
  float *pfVar7;
  long lVar8;
  allocator<char> local_71;
  aiNode *attachments_node;
  aiVector3t<float> local_68;
  HL1MDLLoader *local_58;
  string local_50;
  
  pHVar3 = this->header_;
  if (pHVar3->numattachments != 0) {
    iVar1 = pHVar3->attachmentindex;
    paVar4 = (aiNode *)operator_new(0x478);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"<MDL_attachments>",(allocator<char> *)&local_68);
    aiNode::aiNode(paVar4,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    attachments_node = paVar4;
    std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back
              (&this->rootnode_children_,&attachments_node);
    paVar4 = attachments_node;
    uVar2 = this->header_->numattachments;
    attachments_node->mNumChildren = uVar2;
    ppaVar5 = (aiNode **)operator_new__((ulong)uVar2 << 3);
    paVar4->mChildren = ppaVar5;
    pfVar7 = (float *)(pHVar3->name + (long)iVar1 + 0x28);
    local_58 = this;
    for (lVar8 = 0; lVar8 < this->header_->numattachments; lVar8 = lVar8 + 1) {
      paVar4 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar4);
      attachments_node->mChildren[lVar8] = paVar4;
      paVar4->mParent = attachments_node;
      paVar6 = aiMetadata::Alloc(2);
      paVar4->mMetaData = paVar6;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Position",&local_71);
      local_68.z = *pfVar7;
      local_68._0_8_ = ((Header_HL1 *)(pfVar7 + -2))->super_HalfLifeMDLBaseHeader;
      aiMetadata::Set<aiVector3t<float>>(paVar6,0,&local_50,&local_68);
      std::__cxx11::string::~string((string *)&local_50);
      paVar6 = paVar4->mMetaData;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Bone",(allocator<char> *)&local_68);
      this = local_58;
      aiMetadata::Set<aiString>
                (paVar6,1,&local_50,
                 &((local_58->temp_bones_).
                   super__Vector_base<Assimp::MDL::HalfLife::HL1MDLLoader::TempBone,_std::allocator<Assimp::MDL::HalfLife::HL1MDLLoader::TempBone>_>
                   ._M_impl.super__Vector_impl_data._M_start[(int)pfVar7[-3]].node)->mName);
      std::__cxx11::string::~string((string *)&local_50);
      pfVar7 = pfVar7 + 0x16;
    }
  }
  return;
}

Assistant:

void HL1MDLLoader::read_attachments() {
    if (!header_->numattachments)
        return;

    const Attachment_HL1 *pattach = (const Attachment_HL1 *)((uint8_t *)header_ + header_->attachmentindex);

    aiNode *attachments_node = new aiNode(AI_MDL_HL1_NODE_ATTACHMENTS);
    rootnode_children_.push_back(attachments_node);
    attachments_node->mNumChildren = static_cast<unsigned int>(header_->numattachments);
    attachments_node->mChildren = new aiNode *[attachments_node->mNumChildren];

    for (int i = 0; i < header_->numattachments; ++i, ++pattach) {
        aiNode *attachment_node = attachments_node->mChildren[i] = new aiNode();
        attachment_node->mParent = attachments_node;
        attachment_node->mMetaData = aiMetadata::Alloc(2);
        attachment_node->mMetaData->Set(0, "Position", aiVector3D(pattach->org[0], pattach->org[1], pattach->org[2]));
        // Reference the bone by name. This allows us to search a particular
        // bone by name using aiNode(s).
        attachment_node->mMetaData->Set(1, "Bone", temp_bones_[pattach->bone].node->mName);
    }
}